

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O2

void armci_stride_info_next(stride_info_t *sinfo)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  char *__assertion;
  
  if (sinfo == (stride_info_t *)0x0) {
    __assertion = "sinfo!=NULL";
    uVar1 = 0x60;
  }
  else {
    if (sinfo->pos < sinfo->size) {
      sinfo->pos = sinfo->pos + 1;
      uVar1 = sinfo->stride_levels;
      if (0 < (int)uVar1) {
        iVar4 = sinfo->itr[0] + 1;
        sinfo->itr[0] = iVar4;
        uVar3 = (ulong)(uVar1 - 1);
        for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
          if (iVar4 != sinfo->seg_count[uVar2 + 1]) {
            uVar1 = (int)uVar2 + 1;
            uVar3 = uVar2;
            break;
          }
          sinfo->itr[uVar2] = 0;
          iVar4 = sinfo->itr[uVar2 + 1] + 1;
          sinfo->itr[uVar2 + 1] = iVar4;
        }
        if (sinfo->seg_count[uVar1] < sinfo->itr[uVar3]) {
          __assertion = "sinfo->itr[i] <= sinfo->seg_count[i+1]";
          uVar1 = 0x69;
          goto LAB_0019d458;
        }
      }
      return;
    }
    __assertion = "sinfo->pos <sinfo->size";
    uVar1 = 0x61;
  }
LAB_0019d458:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                ,uVar1,"void armci_stride_info_next(stride_info_t *)");
}

Assistant:

void armci_stride_info_next(stride_info_t *sinfo) {
  int i;
  assert(sinfo!=NULL);
  assert(sinfo->pos <sinfo->size);
  sinfo->pos += 1;
  if(sinfo->stride_levels>0) {
    sinfo->itr[0] += 1;
    for(i=0; i<sinfo->stride_levels-1 && sinfo->itr[i]==sinfo->seg_count[i+1]; i++) {
      sinfo->itr[i] = 0;
      sinfo->itr[i+1] += 1;
    }
    assert(sinfo->itr[i] <= sinfo->seg_count[i+1]);
  }
}